

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int lookupName(Parse *pParse,char *zDb,char *zTab,char *zCol,NameContext *pNC,Expr *pExpr)

{
  byte *pbVar1;
  char cVar2;
  short sVar3;
  ushort uVar4;
  sqlite3 *psVar5;
  Db *pDVar6;
  SrcList *pSVar7;
  Table *pTVar8;
  Select *pSVar9;
  IdList *pIVar10;
  IdList_item *pIVar11;
  ExprList *pEVar12;
  ExprList_item *pEList;
  ExprList_item *zLeft;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  Table **ppTVar19;
  ushort uVar20;
  ulong uVar21;
  ulong uVar22;
  char *pcVar23;
  char **ppcVar24;
  Column *pCVar25;
  SrcList_item *pSVar26;
  Schema **ppSVar27;
  int iVar28;
  uint uVar29;
  ExprList_item **ppEVar30;
  SrcList_item *pSVar31;
  long lVar32;
  u8 uVar33;
  long lVar34;
  uint uVar35;
  uint uVar36;
  NameContext *pNVar37;
  bool bVar38;
  int local_94;
  Schema *local_70;
  int local_4c;
  
  psVar5 = pParse->db;
  pExpr->iTable = -1;
  pExpr->pTab = (Table *)0x0;
  if (zDb == (char *)0x0) {
    local_70 = (Schema *)0x0;
LAB_0015a033:
    if (pNC != (NameContext *)0x0) goto LAB_0015a03c;
    uVar33 = 0x98;
    pSVar31 = (SrcList_item *)0x0;
    if (zTab == (char *)0x0) {
      bVar38 = true;
      pNVar37 = (NameContext *)0x0;
      goto LAB_0015a6ee;
    }
    pcVar23 = "no such column";
    pNVar37 = (NameContext *)0x0;
    bVar38 = false;
  }
  else {
    if ((pNC->ncFlags & 6) == 0) {
      iVar18 = psVar5->nDb;
      if (0 < (long)iVar18) {
        pDVar6 = psVar5->aDb;
        local_70 = (Schema *)0x0;
        lVar32 = 0;
        do {
          iVar14 = sqlite3StrICmp(*(char **)((long)&pDVar6->zDbSName + lVar32),zDb);
          if (iVar14 == 0) {
            local_70 = *(Schema **)((long)&pDVar6->pSchema + lVar32);
            break;
          }
          lVar32 = lVar32 + 0x20;
        } while ((long)iVar18 * 0x20 != lVar32);
        goto LAB_0015a033;
      }
      local_70 = (Schema *)0x0;
    }
    else {
      zDb = (char *)0x0;
      local_70 = (Schema *)0x0;
    }
LAB_0015a03c:
    iVar18 = 0;
    bVar38 = false;
    pSVar31 = (SrcList_item *)0x0;
    local_4c = 0;
    pNVar37 = pNC;
    do {
      pSVar7 = pNVar37->pSrcList;
      if (pSVar7 == (SrcList *)0x0) {
        local_94 = 0;
      }
      else {
        iVar14 = pSVar7->nSrc;
        if (iVar14 < 1) {
          local_94 = 0;
        }
        else {
          pSVar26 = pSVar7->a;
          iVar28 = 0;
          local_94 = 0;
          do {
            pTVar8 = pSVar26->pTab;
            pSVar9 = pSVar26->pSelect;
            if ((pSVar9 == (Select *)0x0) || ((pSVar9->selFlags & 0x800) == 0)) {
LAB_0015a15f:
              if ((zDb == (char *)0x0) || (pTVar8->pSchema == local_70)) {
                if (zTab != (char *)0x0) {
                  pcVar23 = pSVar26->zAlias;
                  if (pcVar23 == (char *)0x0) {
                    pcVar23 = pTVar8->zName;
                  }
                  iVar15 = sqlite3StrICmp(pcVar23,zTab);
                  if (iVar15 != 0) goto LAB_0015a2a5;
                }
                iVar15 = iVar18 + 1;
                if (iVar18 == 0) {
                  pSVar31 = pSVar26;
                }
                sVar3 = pTVar8->nCol;
                iVar18 = iVar15;
                if (0 < sVar3) {
                  pCVar25 = pTVar8->aCol;
                  iVar15 = 0;
                  do {
                    iVar16 = sqlite3StrICmp(pCVar25->zName,zCol);
                    if (iVar16 == 0) {
                      if (local_94 != 1) {
LAB_0015a268:
                        local_94 = local_94 + 1;
                        if (iVar15 == pTVar8->iPKey) {
                          iVar15 = 0xffff;
                        }
                        pExpr->iColumn = (ynVar)iVar15;
                        pSVar31 = pSVar26;
                        break;
                      }
                      if (((pSVar26->fg).jointype & 4) == 0) {
                        pIVar10 = pSVar26->pUsing;
                        if ((pIVar10 == (IdList *)0x0) || (iVar16 = pIVar10->nId, (long)iVar16 < 1))
                        goto LAB_0015a268;
                        pIVar11 = pIVar10->a;
                        lVar32 = 0;
                        while (iVar17 = sqlite3StrICmp(*(char **)((long)&pIVar11->zName + lVar32),
                                                       zCol), iVar17 != 0) {
                          lVar32 = lVar32 + 0x10;
                          if ((long)iVar16 * 0x10 == lVar32) goto LAB_0015a268;
                        }
                      }
                    }
                    iVar15 = iVar15 + 1;
                    pCVar25 = pCVar25 + 1;
                  } while (iVar15 != sVar3);
                }
              }
            }
            else {
              lVar32 = (long)pSVar9->pEList->nExpr;
              bVar13 = false;
              if (0 < lVar32) {
                ppcVar24 = &pSVar9->pEList->a->zSpan;
                lVar34 = 0;
                do {
                  iVar15 = sqlite3MatchSpanName(*ppcVar24,zCol,zTab,zDb);
                  if (iVar15 != 0) {
                    local_94 = local_94 + 1;
                    pExpr->iColumn = (ynVar)lVar34;
                    bVar13 = true;
                    iVar18 = 2;
                    pSVar31 = pSVar26;
                  }
                  lVar34 = lVar34 + 1;
                  ppcVar24 = ppcVar24 + 4;
                } while (lVar32 != lVar34);
              }
              if (zTab != (char *)0x0 && !bVar13) goto LAB_0015a15f;
            }
LAB_0015a2a5:
            iVar28 = iVar28 + 1;
            pSVar26 = pSVar26 + 1;
          } while (iVar28 != iVar14);
        }
        if (pSVar31 == (SrcList_item *)0x0) {
          pSVar31 = (SrcList_item *)0x0;
        }
        else {
          pExpr->iTable = pSVar31->iCursor;
          pTVar8 = pSVar31->pTab;
          pExpr->pTab = pTVar8;
          if (((pSVar31->fg).jointype & 8) != 0) {
            pbVar1 = (byte *)((long)&pExpr->flags + 2);
            *pbVar1 = *pbVar1 | 0x10;
          }
          local_70 = pTVar8->pSchema;
        }
      }
      if (iVar18 == 0 && (zTab != (char *)0x0 && zDb == (char *)0x0)) {
        pTVar8 = pParse->pTriggerTab;
        if (pTVar8 != (Table *)0x0) {
          uVar33 = pParse->eTriggerOp;
          if (uVar33 == 'm') {
LAB_0015a373:
            iVar18 = sqlite3StrICmp("old",zTab);
            iVar14 = 0;
            if (iVar18 != 0) goto LAB_0015a393;
            bVar13 = true;
          }
          else {
            iVar18 = sqlite3StrICmp("new",zTab);
            if (iVar18 != 0) {
              if (uVar33 == 'l') goto LAB_0015a393;
              goto LAB_0015a373;
            }
            iVar14 = 1;
            bVar13 = false;
          }
          pExpr->iTable = iVar14;
          local_70 = pTVar8->pSchema;
          uVar29 = (uint)pTVar8->nCol;
          if (pTVar8->nCol < 1) {
            uVar36 = 0;
LAB_0015a408:
            if ((int)uVar29 <= (int)uVar36) goto LAB_0015a412;
          }
          else {
            pCVar25 = pTVar8->aCol;
            uVar35 = 0;
            do {
              iVar18 = sqlite3StrICmp(pCVar25->zName,zCol);
              if (iVar18 == 0) {
                uVar36 = uVar35;
                if ((int)pTVar8->iPKey == uVar35) {
                  uVar36 = 0xffffffff;
                }
                goto LAB_0015a408;
              }
              uVar35 = uVar35 + 1;
              pCVar25 = pCVar25 + 1;
              uVar36 = uVar29;
            } while (uVar29 != uVar35);
LAB_0015a412:
            iVar18 = sqlite3IsRowid(zCol);
            if (iVar18 != 0) {
              uVar36 = uVar36 | -(uint)((pTVar8->tabFlags & 0x40) == 0);
            }
          }
          if ((int)uVar36 < (int)uVar29) {
            if ((int)uVar36 < 0) {
              pExpr->affinity = 'D';
            }
            else {
              uVar29 = 1 << ((byte)uVar36 & 0x1f);
              if (0x1f < uVar36) {
                uVar29 = 0xffffffff;
              }
              if (bVar13) {
                pParse->oldmask = pParse->oldmask | uVar29;
              }
              else {
                pParse->newmask = pParse->newmask | uVar29;
              }
            }
            local_94 = local_94 + 1;
            pExpr->iColumn = (ynVar)uVar36;
            pExpr->pTab = pTVar8;
            bVar38 = true;
          }
          iVar18 = 1;
          goto LAB_0015a4c3;
        }
LAB_0015a393:
        iVar18 = 0;
LAB_0015a580:
        if (local_94 != 0) {
          uVar33 = 'X';
          if (!bVar38) {
            uVar33 = 0x98;
          }
          bVar38 = zTab == (char *)0x0;
          bVar13 = true;
          if (local_94 == 1) goto LAB_0015a77b;
          pcVar23 = "ambiguous column name";
          goto LAB_0015a6fb;
        }
      }
      else {
LAB_0015a4c3:
        if ((((local_94 == 0) && (iVar18 == 1)) && (pSVar31 != (SrcList_item *)0x0)) &&
           (iVar18 = 1, (pNVar37->ncFlags & 0x20) == 0)) {
          iVar18 = sqlite3IsRowid(zCol);
          if (iVar18 == 0) {
            iVar18 = 1;
          }
          else {
            iVar18 = 1;
            if ((pSVar31->pTab->tabFlags & 0x40) == 0) {
              pExpr->iColumn = -1;
              pExpr->affinity = 'D';
              uVar33 = 'X';
              if (!bVar38) {
                uVar33 = 0x98;
              }
              bVar13 = true;
              goto LAB_0015a77b;
            }
          }
        }
        if (((local_94 != 0) || (zTab != (char *)0x0)) ||
           (pEVar12 = pNVar37->pEList, pEVar12 == (ExprList *)0x0)) goto LAB_0015a580;
        iVar14 = pEVar12->nExpr;
        if (0 < (long)iVar14) {
          pEList = pEVar12->a;
          ppEVar30 = (ExprList_item **)&pEList->zName;
          lVar32 = 0;
          do {
            zLeft = *ppEVar30;
            if ((zLeft != (ExprList_item *)0x0) &&
               (iVar28 = sqlite3StrICmp((char *)zLeft,zCol), iVar28 == 0)) {
              pcVar23 = *(char **)(ppEVar30 + -1);
              if (((pNVar37->ncFlags & 1) == 0) && ((pcVar23[4] & 2U) != 0)) {
                sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s",zLeft);
                return 2;
              }
              cVar2 = *pcVar23;
              if (cVar2 == -99) {
                cVar2 = pcVar23[0x36];
              }
              if (cVar2 == 'w') {
                pcVar23 = *(char **)(pcVar23 + 0x20);
LAB_0015a681:
                if (**(int **)pcVar23 != 1) {
                  sqlite3ErrorMsg(pParse,"row value misused");
                  return 2;
                }
              }
              else if (cVar2 == -0x62) {
                pcVar23 = pcVar23 + 0x20;
                goto LAB_0015a681;
              }
              resolveAlias(pParse,(ExprList *)pEList,(int)lVar32,pExpr,"",local_4c);
              goto LAB_0015a7fe;
            }
            lVar32 = lVar32 + 1;
            ppEVar30 = ppEVar30 + 4;
          } while (iVar14 != lVar32);
        }
      }
      pNVar37 = pNVar37->pNext;
      local_4c = local_4c + 1;
    } while (pNVar37 != (NameContext *)0x0);
    uVar33 = 'X';
    if (!bVar38) {
      uVar33 = 0x98;
    }
    bVar38 = zTab == (char *)0x0;
    if (bVar38) {
LAB_0015a6ee:
      if ((pExpr->flags & 0x40) != 0) {
        pExpr->op = 'a';
        pExpr->pTab = (Table *)0x0;
        return 1;
      }
    }
    else {
      bVar38 = false;
    }
    pcVar23 = "no such column";
  }
LAB_0015a6fb:
  if (zDb == (char *)0x0) {
    if (bVar38) {
      sqlite3ErrorMsg(pParse,"%s: %s",pcVar23,zCol);
    }
    else {
      sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar23,zTab,zCol);
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar23,zDb,zTab,zCol);
  }
  pParse->checkSchema = '\x01';
  pNC->nErr = pNC->nErr + 1;
  bVar13 = false;
LAB_0015a77b:
  uVar4 = pExpr->iColumn;
  if ((-1 < (short)uVar4) && (pSVar31 != (SrcList_item *)0x0)) {
    uVar20 = 0x3f;
    if (uVar4 < 0x3f) {
      uVar20 = uVar4;
    }
    pSVar31->colUsed = pSVar31->colUsed | 1L << ((byte)uVar20 & 0x3f);
  }
  if (pExpr->pLeft != (Expr *)0x0) {
    sqlite3ExprDeleteNN(psVar5,pExpr->pLeft);
  }
  pExpr->pLeft = (Expr *)0x0;
  if (pExpr->pRight != (Expr *)0x0) {
    sqlite3ExprDeleteNN(psVar5,pExpr->pRight);
  }
  pExpr->pRight = (Expr *)0x0;
  pExpr->op = uVar33;
  if (!bVar13) {
    return 2;
  }
LAB_0015a7fe:
  if ((((pExpr->flags & 0x400000) == 0) && (local_70 != (Schema *)0x0)) &&
     (psVar5 = pParse->db, psVar5->xAuth != (sqlite3_xauth)0x0)) {
    uVar29 = psVar5->nDb;
    if ((int)uVar29 < 1) {
      iVar18 = 0;
    }
    else {
      ppSVar27 = &psVar5->aDb->pSchema;
      uVar21 = 0;
      do {
        uVar22 = uVar21;
        if (*ppSVar27 == local_70) break;
        uVar21 = uVar21 + 1;
        ppSVar27 = ppSVar27 + 4;
        uVar22 = (ulong)uVar29;
      } while (uVar29 != uVar21);
      iVar18 = (int)uVar22;
      if (iVar18 < 0) goto LAB_0015a8ce;
    }
    if (pExpr->op == 'X') {
      ppTVar19 = &pParse->pTriggerTab;
LAB_0015a86f:
      pTVar8 = *ppTVar19;
      if (pTVar8 != (Table *)0x0) {
        lVar32 = (long)pExpr->iColumn;
        if ((pExpr->iColumn < 0) && (lVar32 = (long)pTVar8->iPKey, lVar32 < 0)) {
          pcVar23 = "ROWID";
        }
        else {
          pcVar23 = pTVar8->aCol[lVar32].zName;
        }
        iVar18 = sqlite3AuthReadCol(pParse,pTVar8->zName,pcVar23,iVar18);
        if (iVar18 == 2) {
          pExpr->op = 'e';
        }
      }
    }
    else {
      lVar32 = (long)pNVar37->pSrcList->nSrc;
      if (0 < lVar32) {
        ppTVar19 = &pNVar37->pSrcList->a[0].pTab;
        do {
          if (pExpr->iTable == *(int *)((long)ppTVar19 + 0x24)) goto LAB_0015a86f;
          ppTVar19 = ppTVar19 + 0xe;
          lVar32 = lVar32 + -1;
        } while (lVar32 != 0);
      }
    }
  }
LAB_0015a8ce:
  pNC->nRef = pNC->nRef + 1;
  if (pNVar37 != pNC) {
    do {
      pNC = pNC->pNext;
      pNC->nRef = pNC->nRef + 1;
    } while (pNC != pNVar37);
  }
  return 1;
}

Assistant:

static int lookupName(
  Parse *pParse,       /* The parsing context */
  const char *zDb,     /* Name of the database containing table, or NULL */
  const char *zTab,    /* Name of table containing column, or NULL */
  const char *zCol,    /* Name of the column. */
  NameContext *pNC,    /* The name context used to resolve the name */
  Expr *pExpr          /* Make this EXPR node point to the selected column */
){
  int i, j;                         /* Loop counters */
  int cnt = 0;                      /* Number of matching column names */
  int cntTab = 0;                   /* Number of matching table names */
  int nSubquery = 0;                /* How many levels of subquery */
  sqlite3 *db = pParse->db;         /* The database connection */
  struct SrcList_item *pItem;       /* Use for looping over pSrcList items */
  struct SrcList_item *pMatch = 0;  /* The matching pSrcList item */
  NameContext *pTopNC = pNC;        /* First namecontext in the list */
  Schema *pSchema = 0;              /* Schema of the expression */
  int isTrigger = 0;                /* True if resolved to a trigger column */
  Table *pTab = 0;                  /* Table hold the row */
  Column *pCol;                     /* A column of pTab */

  assert( pNC );     /* the name context cannot be NULL. */
  assert( zCol );    /* The Z in X.Y.Z cannot be NULL */
  assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );

  /* Initialize the node to no-match */
  pExpr->iTable = -1;
  pExpr->pTab = 0;
  ExprSetVVAProperty(pExpr, EP_NoReduce);

  /* Translate the schema name in zDb into a pointer to the corresponding
  ** schema.  If not found, pSchema will remain NULL and nothing will match
  ** resulting in an appropriate error message toward the end of this routine
  */
  if( zDb ){
    testcase( pNC->ncFlags & NC_PartIdx );
    testcase( pNC->ncFlags & NC_IsCheck );
    if( (pNC->ncFlags & (NC_PartIdx|NC_IsCheck))!=0 ){
      /* Silently ignore database qualifiers inside CHECK constraints and
      ** partial indices.  Do not raise errors because that might break
      ** legacy and because it does not hurt anything to just ignore the
      ** database name. */
      zDb = 0;
    }else{
      for(i=0; i<db->nDb; i++){
        assert( db->aDb[i].zDbSName );
        if( sqlite3StrICmp(db->aDb[i].zDbSName,zDb)==0 ){
          pSchema = db->aDb[i].pSchema;
          break;
        }
      }
    }
  }

  /* Start at the inner-most context and move outward until a match is found */
  while( pNC && cnt==0 ){
    ExprList *pEList;
    SrcList *pSrcList = pNC->pSrcList;

    if( pSrcList ){
      for(i=0, pItem=pSrcList->a; i<pSrcList->nSrc; i++, pItem++){
        pTab = pItem->pTab;
        assert( pTab!=0 && pTab->zName!=0 );
        assert( pTab->nCol>0 );
        if( pItem->pSelect && (pItem->pSelect->selFlags & SF_NestedFrom)!=0 ){
          int hit = 0;
          pEList = pItem->pSelect->pEList;
          for(j=0; j<pEList->nExpr; j++){
            if( sqlite3MatchSpanName(pEList->a[j].zSpan, zCol, zTab, zDb) ){
              cnt++;
              cntTab = 2;
              pMatch = pItem;
              pExpr->iColumn = j;
              hit = 1;
            }
          }
          if( hit || zTab==0 ) continue;
        }
        if( zDb && pTab->pSchema!=pSchema ){
          continue;
        }
        if( zTab ){
          const char *zTabName = pItem->zAlias ? pItem->zAlias : pTab->zName;
          assert( zTabName!=0 );
          if( sqlite3StrICmp(zTabName, zTab)!=0 ){
            continue;
          }
        }
        if( 0==(cntTab++) ){
          pMatch = pItem;
        }
        for(j=0, pCol=pTab->aCol; j<pTab->nCol; j++, pCol++){
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            /* If there has been exactly one prior match and this match
            ** is for the right-hand table of a NATURAL JOIN or is in a 
            ** USING clause, then skip this match.
            */
            if( cnt==1 ){
              if( pItem->fg.jointype & JT_NATURAL ) continue;
              if( nameInUsingClause(pItem->pUsing, zCol) ) continue;
            }
            cnt++;
            pMatch = pItem;
            /* Substitute the rowid (column -1) for the INTEGER PRIMARY KEY */
            pExpr->iColumn = j==pTab->iPKey ? -1 : (i16)j;
            break;
          }
        }
      }
      if( pMatch ){
        pExpr->iTable = pMatch->iCursor;
        pExpr->pTab = pMatch->pTab;
        /* RIGHT JOIN not (yet) supported */
        assert( (pMatch->fg.jointype & JT_RIGHT)==0 );
        if( (pMatch->fg.jointype & JT_LEFT)!=0 ){
          ExprSetProperty(pExpr, EP_CanBeNull);
        }
        pSchema = pExpr->pTab->pSchema;
      }
    } /* if( pSrcList ) */

#ifndef SQLITE_OMIT_TRIGGER
    /* If we have not already resolved the name, then maybe 
    ** it is a new.* or old.* trigger argument reference
    */
    if( zDb==0 && zTab!=0 && cntTab==0 && pParse->pTriggerTab!=0 ){
      int op = pParse->eTriggerOp;
      assert( op==TK_DELETE || op==TK_UPDATE || op==TK_INSERT );
      if( op!=TK_DELETE && sqlite3StrICmp("new",zTab) == 0 ){
        pExpr->iTable = 1;
        pTab = pParse->pTriggerTab;
      }else if( op!=TK_INSERT && sqlite3StrICmp("old",zTab)==0 ){
        pExpr->iTable = 0;
        pTab = pParse->pTriggerTab;
      }else{
        pTab = 0;
      }

      if( pTab ){ 
        int iCol;
        pSchema = pTab->pSchema;
        cntTab++;
        for(iCol=0, pCol=pTab->aCol; iCol<pTab->nCol; iCol++, pCol++){
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            if( iCol==pTab->iPKey ){
              iCol = -1;
            }
            break;
          }
        }
        if( iCol>=pTab->nCol && sqlite3IsRowid(zCol) && VisibleRowid(pTab) ){
          /* IMP: R-51414-32910 */
          iCol = -1;
        }
        if( iCol<pTab->nCol ){
          cnt++;
          if( iCol<0 ){
            pExpr->affinity = SQLITE_AFF_INTEGER;
          }else if( pExpr->iTable==0 ){
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->oldmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }else{
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->newmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }
          pExpr->iColumn = (i16)iCol;
          pExpr->pTab = pTab;
          isTrigger = 1;
        }
      }
    }
#endif /* !defined(SQLITE_OMIT_TRIGGER) */

    /*
    ** Perhaps the name is a reference to the ROWID
    */
    if( cnt==0
     && cntTab==1
     && pMatch
     && (pNC->ncFlags & NC_IdxExpr)==0
     && sqlite3IsRowid(zCol)
     && VisibleRowid(pMatch->pTab)
    ){
      cnt = 1;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
    }

    /*
    ** If the input is of the form Z (not Y.Z or X.Y.Z) then the name Z
    ** might refer to an result-set alias.  This happens, for example, when
    ** we are resolving names in the WHERE clause of the following command:
    **
    **     SELECT a+b AS x FROM table WHERE x<10;
    **
    ** In cases like this, replace pExpr with a copy of the expression that
    ** forms the result set entry ("a+b" in the example) and return immediately.
    ** Note that the expression in the result set should have already been
    ** resolved by the time the WHERE clause is resolved.
    **
    ** The ability to use an output result-set column in the WHERE, GROUP BY,
    ** or HAVING clauses, or as part of a larger expression in the ORDER BY
    ** clause is not standard SQL.  This is a (goofy) SQLite extension, that
    ** is supported for backwards compatibility only. Hence, we issue a warning
    ** on sqlite3_log() whenever the capability is used.
    */
    if( (pEList = pNC->pEList)!=0
     && zTab==0
     && cnt==0
    ){
      for(j=0; j<pEList->nExpr; j++){
        char *zAs = pEList->a[j].zName;
        if( zAs!=0 && sqlite3StrICmp(zAs, zCol)==0 ){
          Expr *pOrig;
          assert( pExpr->pLeft==0 && pExpr->pRight==0 );
          assert( pExpr->x.pList==0 );
          assert( pExpr->x.pSelect==0 );
          pOrig = pEList->a[j].pExpr;
          if( (pNC->ncFlags&NC_AllowAgg)==0 && ExprHasProperty(pOrig, EP_Agg) ){
            sqlite3ErrorMsg(pParse, "misuse of aliased aggregate %s", zAs);
            return WRC_Abort;
          }
          if( sqlite3ExprVectorSize(pOrig)!=1 ){
            sqlite3ErrorMsg(pParse, "row value misused");
            return WRC_Abort;
          }
          resolveAlias(pParse, pEList, j, pExpr, "", nSubquery);
          cnt = 1;
          pMatch = 0;
          assert( zTab==0 && zDb==0 );
          goto lookupname_end;
        }
      } 
    }

    /* Advance to the next name context.  The loop will exit when either
    ** we have a match (cnt>0) or when we run out of name contexts.
    */
    if( cnt==0 ){
      pNC = pNC->pNext;
      nSubquery++;
    }
  }

  /*
  ** If X and Y are NULL (in other words if only the column name Z is
  ** supplied) and the value of Z is enclosed in double-quotes, then
  ** Z is a string literal if it doesn't match any column names.  In that
  ** case, we need to return right away and not make any changes to
  ** pExpr.
  **
  ** Because no reference was made to outer contexts, the pNC->nRef
  ** fields are not changed in any context.
  */
  if( cnt==0 && zTab==0 && ExprHasProperty(pExpr,EP_DblQuoted) ){
    pExpr->op = TK_STRING;
    pExpr->pTab = 0;
    return WRC_Prune;
  }

  /*
  ** cnt==0 means there was not match.  cnt>1 means there were two or
  ** more matches.  Either way, we have an error.
  */
  if( cnt!=1 ){
    const char *zErr;
    zErr = cnt==0 ? "no such column" : "ambiguous column name";
    if( zDb ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s.%s", zErr, zDb, zTab, zCol);
    }else if( zTab ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zErr, zTab, zCol);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zErr, zCol);
    }
    pParse->checkSchema = 1;
    pTopNC->nErr++;
  }

  /* If a column from a table in pSrcList is referenced, then record
  ** this fact in the pSrcList.a[].colUsed bitmask.  Column 0 causes
  ** bit 0 to be set.  Column 1 sets bit 1.  And so forth.  If the
  ** column number is greater than the number of bits in the bitmask
  ** then set the high-order bit of the bitmask.
  */
  if( pExpr->iColumn>=0 && pMatch!=0 ){
    int n = pExpr->iColumn;
    testcase( n==BMS-1 );
    if( n>=BMS ){
      n = BMS-1;
    }
    assert( pMatch->iCursor==pExpr->iTable );
    pMatch->colUsed |= ((Bitmask)1)<<n;
  }

  /* Clean up and return
  */
  sqlite3ExprDelete(db, pExpr->pLeft);
  pExpr->pLeft = 0;
  sqlite3ExprDelete(db, pExpr->pRight);
  pExpr->pRight = 0;
  pExpr->op = (isTrigger ? TK_TRIGGER : TK_COLUMN);
lookupname_end:
  if( cnt==1 ){
    assert( pNC!=0 );
    if( !ExprHasProperty(pExpr, EP_Alias) ){
      sqlite3AuthRead(pParse, pExpr, pSchema, pNC->pSrcList);
    }
    /* Increment the nRef value on all name contexts from TopNC up to
    ** the point where the name matched. */
    for(;;){
      assert( pTopNC!=0 );
      pTopNC->nRef++;
      if( pTopNC==pNC ) break;
      pTopNC = pTopNC->pNext;
    }
    return WRC_Prune;
  } else {
    return WRC_Abort;
  }
}